

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportMan.cpp
# Opt level: O0

void __thiscall
adios2::transportman::TransportMan::WriteFiles
          (TransportMan *this,iovec *iov,size_t iovcnt,int transportIndex)

{
  bool bVar1;
  element_type *peVar2;
  int in_ECX;
  ulong in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  iterator itTransport;
  shared_ptr<adios2::Transport> *transport;
  pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_> *transportPair;
  iterator __end3;
  iterator __begin3;
  unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
  *__range3;
  string *in_stack_000000f0;
  TransportMan *in_stack_000000f8;
  const_iterator in_stack_00000100;
  unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
  *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80 [12];
  int in_stack_ffffffffffffff8c;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
  local_30;
  char *local_28;
  ulong local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_ECX == -1) {
    local_28 = in_RDI + 8;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
         ::begin(in_stack_ffffffffffffff38);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
         ::end(in_stack_ffffffffffffff38);
    while (bVar1 = std::__detail::operator!=(&local_30,&local_38), bVar1) {
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
      ::operator*((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                   *)0xd66a47);
      std::__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0xd66a70);
      bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xd66a96);
        (*peVar2->_vptr_Transport[7])(peVar2,local_10,local_18 & 0xffffffff,0xffffffffffffffff);
      }
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                    *)in_stack_ffffffffffffff40);
    }
  }
  else {
    std::
    unordered_map<unsigned_long,_std::shared_ptr<adios2::Transport>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>_>
    ::find(in_stack_ffffffffffffff38,(key_type *)0xd66af1);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
    ::_Node_const_iterator
              ((_Node_const_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                *)in_stack_ffffffffffffff40,
               (_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                *)in_stack_ffffffffffffff38);
    __rhs = &local_a0;
    std::__cxx11::to_string(in_stack_ffffffffffffff8c);
    std::operator+(in_RDI,__rhs);
    CheckFile(in_stack_000000f8,in_stack_00000100,in_stack_000000f0);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false,_false>
                  *)0xd66b67);
    peVar2 = std::__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<adios2::Transport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xd66b73);
    (*peVar2->_vptr_Transport[7])(peVar2,local_10,local_18 & 0xffffffff,0xffffffffffffffff);
  }
  return;
}

Assistant:

void TransportMan::WriteFiles(const core::iovec *iov, const size_t iovcnt, const int transportIndex)
{
    if (transportIndex == -1)
    {
        for (auto &transportPair : m_Transports)
        {
            auto &transport = transportPair.second;
            if (transport->m_Type == "File")
            {
                transport->WriteV(iov, static_cast<int>(iovcnt));
            }
        }
    }
    else
    {
        auto itTransport = m_Transports.find(transportIndex);
        CheckFile(itTransport,
                  ", in call to WriteFiles with index " + std::to_string(transportIndex));
        itTransport->second->WriteV(iov, static_cast<int>(iovcnt));
    }
}